

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::RenderMarkerPlus
               (ImDrawList *DrawList,ImVec2 *c,float s,bool param_4,ImU32 col_outline,bool param_6,
               ImU32 param_7,float weight)

{
  ImVec2 local_58;
  ImVec2 marker [4];
  float weight_local;
  ImU32 param_6_local;
  bool param_5_local;
  ImU32 col_outline_local;
  bool param_3_local;
  float s_local;
  ImVec2 *c_local;
  ImDrawList *DrawList_local;
  
  ImVec2::ImVec2(&local_58,1.0,0.0);
  ImVec2::ImVec2(marker,0.0,-1.0);
  ImVec2::ImVec2(marker + 1,-1.0,0.0);
  ImVec2::ImVec2(marker + 2,0.0,1.0);
  TransformMarker(&local_58,4,c,s);
  ImDrawList::AddLine(DrawList,&local_58,marker + 1,col_outline,weight);
  ImDrawList::AddLine(DrawList,marker,marker + 2,col_outline,weight);
  return;
}

Assistant:

inline void RenderMarkerPlus(ImDrawList& DrawList, const ImVec2& c, float s, bool /*outline*/, ImU32 col_outline, bool /*fill*/, ImU32 /*col_fill*/, float weight) {
    ImVec2 marker[4] = {ImVec2(1, 0), ImVec2(0, -1), ImVec2(-1, 0), ImVec2(0, 1)};
    TransformMarker(marker, 4, c, s);
    DrawList.AddLine(marker[0], marker[2], col_outline, weight);
    DrawList.AddLine(marker[1], marker[3], col_outline, weight);
}